

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validateTagged(Validator *this,uint8_t *ptr,size_t length)

{
  Exception *this_00;
  char *in_RSI;
  size_t in_RDI;
  uint8_t head;
  bool in_stack_0000006f;
  size_t in_stack_00000070;
  uint8_t *in_stack_00000078;
  Validator *in_stack_00000080;
  undefined3 uVar1;
  ExceptionType in_stack_ffffffffffffffcc;
  bool isSubPart;
  size_t in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  char cVar2;
  char *local_10;
  
  cVar2 = *in_RSI;
  local_10 = in_RSI;
  do {
    isSubPart = SUB41(in_stack_ffffffffffffffcc >> 0x18,0);
    if (cVar2 == -0x12) {
      validateBufferLength
                ((Validator *)CONCAT17(0xee,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0,isSubPart);
      local_10 = local_10 + 2;
    }
    else {
      if (cVar2 != -0x11) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception(this_00,in_stack_ffffffffffffffcc);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      validateBufferLength
                ((Validator *)CONCAT17(0xef,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0,isSubPart);
      local_10 = local_10 + 9;
    }
    cVar2 = *local_10;
    uVar1 = (undefined3)in_stack_ffffffffffffffcc;
    in_stack_ffffffffffffffcc = CONCAT13(1,uVar1);
    if (cVar2 != -0x12) {
      in_stack_ffffffffffffffcc = CONCAT13(cVar2 == -0x11,uVar1);
    }
  } while ((char)(in_stack_ffffffffffffffcc >> 0x18) != '\0');
  validatePart(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006f);
  return;
}

Assistant:

void Validator::validateTagged(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  do {
    // looping here to skip over nested tags.
    if (head == 0xee) {
      // 1 byte tag type
      // the actual Slice (without tag) must be at least one byte long
      validateBufferLength(1 + 1 + 1, length, true);
      VELOCYPACK_ASSERT(length > 2);
      ptr += 2;
      length -= 2;
    } else if (head == 0xef) {
      // 8 bytes tag type
      // the actual Slice (without tag) must be at least one byte long
      validateBufferLength(1 + 8 + 1, length, true);
      VELOCYPACK_ASSERT(length > 9);
      ptr += 9;
      length -= 9;
    } else {
      throw Exception(Exception::NotImplemented);
    }
    VELOCYPACK_ASSERT(length > 0);
    head = *ptr;
  } while (head == 0xee || head == 0xef);

  validatePart(ptr, length, true);
}